

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

int lua_setfenv(lua_State *L,int idx)

{
  uint uVar1;
  TValue *pTVar2;
  int in_ESI;
  lua_State *in_RDI;
  GCtab *t;
  cTValue *o;
  TValue *o_1;
  GCobj *in_stack_ffffffffffffffb8;
  
  pTVar2 = index2adr(in_RDI,in_ESI);
  uVar1 = in_RDI->top[-1].u32.lo;
  if ((pTVar2->field_2).it == 0xfffffff7) {
    *(uint *)((ulong)(pTVar2->u32).lo + 8) = uVar1;
  }
  else if ((pTVar2->field_2).it == 0xfffffff3) {
    *(uint *)((ulong)(pTVar2->u32).lo + 8) = uVar1;
  }
  else {
    if ((pTVar2->field_2).it != 0xfffffff9) {
      in_RDI->top = in_RDI->top + -1;
      return 0;
    }
    *(uint *)((ulong)(pTVar2->u32).lo + 0x2c) = uVar1;
  }
  if ((((ulong)((global_State *)(ulong)uVar1)->strhash & 0x300000000) != 0) &&
     ((*(byte *)((ulong)(pTVar2->u32).lo + 4) & 4) != 0)) {
    lj_gc_barrierf((global_State *)(ulong)uVar1,in_stack_ffffffffffffffb8,(GCobj *)0x10fa07);
  }
  in_RDI->top = in_RDI->top + -1;
  return 1;
}

Assistant:

LUA_API int lua_setfenv(lua_State *L, int idx)
{
  cTValue *o = index2adr_check(L, idx);
  GCtab *t;
  lj_checkapi_slot(1);
  lj_checkapi(tvistab(L->top-1), "top stack slot is not a table");
  t = tabV(L->top-1);
  if (tvisfunc(o)) {
    setgcref(funcV(o)->c.env, obj2gco(t));
  } else if (tvisudata(o)) {
    setgcref(udataV(o)->env, obj2gco(t));
  } else if (tvisthread(o)) {
    setgcref(threadV(o)->env, obj2gco(t));
  } else {
    L->top--;
    return 0;
  }
  lj_gc_objbarrier(L, gcV(o), t);
  L->top--;
  return 1;
}